

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sparsehashtable.h
# Opt level: O2

void __thiscall
google::
sparse_hashtable_const_iterator<std::pair<const_HashObject<4,_4>,_int>,_HashObject<4,_4>,_HashFn,_google::sparse_hash_map<HashObject<4,_4>,_int,_HashFn,_std::equal_to<HashObject<4,_4>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<4,_4>,_int>_>_>::SelectKey,_google::sparse_hash_map<HashObject<4,_4>,_int,_HashFn,_std::equal_to<HashObject<4,_4>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<4,_4>,_int>_>_>::SetKey,_std::equal_to<HashObject<4,_4>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<4,_4>,_int>_>_>
::advance_past_deleted
          (sparse_hashtable_const_iterator<std::pair<const_HashObject<4,_4>,_int>,_HashObject<4,_4>,_HashFn,_google::sparse_hash_map<HashObject<4,_4>,_int,_HashFn,_std::equal_to<HashObject<4,_4>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<4,_4>,_int>_>_>::SelectKey,_google::sparse_hash_map<HashObject<4,_4>,_int,_HashFn,_std::equal_to<HashObject<4,_4>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<4,_4>,_int>_>_>::SetKey,_std::equal_to<HashObject<4,_4>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<4,_4>,_int>_>_>
           *this)

{
  bool bVar1;
  
  while( true ) {
    bVar1 = const_two_d_iterator<std::vector<google::sparsegroup<std::pair<const_HashObject<4,_4>,_int>,_(unsigned_short)48,_google::libc_allocator_with_realloc<std::pair<const_HashObject<4,_4>,_int>_>_>,_google::libc_allocator_with_realloc<google::sparsegroup<std::pair<const_HashObject<4,_4>,_int>,_(unsigned_short)48,_google::libc_allocator_with_realloc<std::pair<const_HashObject<4,_4>,_int>_>_>_>_>_>
            ::operator!=(&this->pos,&this->end);
    if (((!bVar1) || (this->ht->num_deleted == 0)) ||
       ((this->ht->key_info).delkey.i_ != (((this->pos).col_current)->first).i_)) break;
    const_two_d_iterator<std::vector<google::sparsegroup<std::pair<const_HashObject<4,_4>,_int>,_(unsigned_short)48,_google::libc_allocator_with_realloc<std::pair<const_HashObject<4,_4>,_int>_>_>,_google::libc_allocator_with_realloc<google::sparsegroup<std::pair<const_HashObject<4,_4>,_int>,_(unsigned_short)48,_google::libc_allocator_with_realloc<std::pair<const_HashObject<4,_4>,_int>_>_>_>_>_>
    ::operator++(&this->pos);
  }
  return;
}

Assistant:

void advance_past_deleted() {
    while (pos != end && ht->test_deleted(*this)) ++pos;
  }